

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_bmrs_no_zeroinit.h
# Opt level: O0

void __thiscall BMRS_XZ<UF>::InitCompressedData(BMRS_XZ<UF> *this,Data_Compressed *data_compressed)

{
  int iVar1;
  int iVar2;
  uchar *puVar3;
  uchar *puVar4;
  int local_60;
  int j_1;
  int jbase;
  uint64_t obits_final;
  uint64_t obits;
  uchar *base;
  int j;
  uchar *source;
  uint64_t *mbits;
  int i;
  int h;
  int w;
  Data_Compressed *data_compressed_local;
  BMRS_XZ<UF> *this_local;
  
  iVar1 = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc;
  iVar2 = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  for (mbits._4_4_ = 0; mbits._4_4_ < iVar2; mbits._4_4_ = mbits._4_4_ + 1) {
    source = (uchar *)Data_Compressed::operator[](data_compressed,(long)mbits._4_4_);
    puVar3 = cv::Mat::ptr<unsigned_char>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,
                        mbits._4_4_);
    for (base._4_4_ = 0; base._4_4_ < iVar1 >> 6; base._4_4_ = base._4_4_ + 1) {
      puVar4 = puVar3 + (base._4_4_ << 6);
      obits_final = (uint64_t)(*puVar4 != '\0');
      if (puVar4[1] != '\0') {
        obits_final = obits_final | 2;
      }
      if (puVar4[2] != '\0') {
        obits_final = obits_final | 4;
      }
      if (puVar4[3] != '\0') {
        obits_final = obits_final | 8;
      }
      if (puVar4[4] != '\0') {
        obits_final = obits_final | 0x10;
      }
      if (puVar4[5] != '\0') {
        obits_final = obits_final | 0x20;
      }
      if (puVar4[6] != '\0') {
        obits_final = obits_final | 0x40;
      }
      if (puVar4[7] != '\0') {
        obits_final = obits_final | 0x80;
      }
      if (puVar4[8] != '\0') {
        obits_final = obits_final | 0x100;
      }
      if (puVar4[9] != '\0') {
        obits_final = obits_final | 0x200;
      }
      if (puVar4[10] != '\0') {
        obits_final = obits_final | 0x400;
      }
      if (puVar4[0xb] != '\0') {
        obits_final = obits_final | 0x800;
      }
      if (puVar4[0xc] != '\0') {
        obits_final = obits_final | 0x1000;
      }
      if (puVar4[0xd] != '\0') {
        obits_final = obits_final | 0x2000;
      }
      if (puVar4[0xe] != '\0') {
        obits_final = obits_final | 0x4000;
      }
      if (puVar4[0xf] != '\0') {
        obits_final = obits_final | 0x8000;
      }
      if (puVar4[0x10] != '\0') {
        obits_final = obits_final | 0x10000;
      }
      if (puVar4[0x11] != '\0') {
        obits_final = obits_final | 0x20000;
      }
      if (puVar4[0x12] != '\0') {
        obits_final = obits_final | 0x40000;
      }
      if (puVar4[0x13] != '\0') {
        obits_final = obits_final | 0x80000;
      }
      if (puVar4[0x14] != '\0') {
        obits_final = obits_final | 0x100000;
      }
      if (puVar4[0x15] != '\0') {
        obits_final = obits_final | 0x200000;
      }
      if (puVar4[0x16] != '\0') {
        obits_final = obits_final | 0x400000;
      }
      if (puVar4[0x17] != '\0') {
        obits_final = obits_final | 0x800000;
      }
      if (puVar4[0x18] != '\0') {
        obits_final = obits_final | 0x1000000;
      }
      if (puVar4[0x19] != '\0') {
        obits_final = obits_final | 0x2000000;
      }
      if (puVar4[0x1a] != '\0') {
        obits_final = obits_final | 0x4000000;
      }
      if (puVar4[0x1b] != '\0') {
        obits_final = obits_final | 0x8000000;
      }
      if (puVar4[0x1c] != '\0') {
        obits_final = obits_final | 0x10000000;
      }
      if (puVar4[0x1d] != '\0') {
        obits_final = obits_final | 0x20000000;
      }
      if (puVar4[0x1e] != '\0') {
        obits_final = obits_final | 0x40000000;
      }
      if (puVar4[0x1f] != '\0') {
        obits_final = obits_final | 0x80000000;
      }
      if (puVar4[0x20] != '\0') {
        obits_final = obits_final | 0x100000000;
      }
      if (puVar4[0x21] != '\0') {
        obits_final = obits_final | 0x200000000;
      }
      if (puVar4[0x22] != '\0') {
        obits_final = obits_final | 0x400000000;
      }
      if (puVar4[0x23] != '\0') {
        obits_final = obits_final | 0x800000000;
      }
      if (puVar4[0x24] != '\0') {
        obits_final = obits_final | 0x1000000000;
      }
      if (puVar4[0x25] != '\0') {
        obits_final = obits_final | 0x2000000000;
      }
      if (puVar4[0x26] != '\0') {
        obits_final = obits_final | 0x4000000000;
      }
      if (puVar4[0x27] != '\0') {
        obits_final = obits_final | 0x8000000000;
      }
      if (puVar4[0x28] != '\0') {
        obits_final = obits_final | 0x10000000000;
      }
      if (puVar4[0x29] != '\0') {
        obits_final = obits_final | 0x20000000000;
      }
      if (puVar4[0x2a] != '\0') {
        obits_final = obits_final | 0x40000000000;
      }
      if (puVar4[0x2b] != '\0') {
        obits_final = obits_final | 0x80000000000;
      }
      if (puVar4[0x2c] != '\0') {
        obits_final = obits_final | 0x100000000000;
      }
      if (puVar4[0x2d] != '\0') {
        obits_final = obits_final | 0x200000000000;
      }
      if (puVar4[0x2e] != '\0') {
        obits_final = obits_final | 0x400000000000;
      }
      if (puVar4[0x2f] != '\0') {
        obits_final = obits_final | 0x800000000000;
      }
      if (puVar4[0x30] != '\0') {
        obits_final = obits_final | 0x1000000000000;
      }
      if (puVar4[0x31] != '\0') {
        obits_final = obits_final | 0x2000000000000;
      }
      if (puVar4[0x32] != '\0') {
        obits_final = obits_final | 0x4000000000000;
      }
      if (puVar4[0x33] != '\0') {
        obits_final = obits_final | 0x8000000000000;
      }
      if (puVar4[0x34] != '\0') {
        obits_final = obits_final | 0x10000000000000;
      }
      if (puVar4[0x35] != '\0') {
        obits_final = obits_final | 0x20000000000000;
      }
      if (puVar4[0x36] != '\0') {
        obits_final = obits_final | 0x40000000000000;
      }
      if (puVar4[0x37] != '\0') {
        obits_final = obits_final | 0x80000000000000;
      }
      if (puVar4[0x38] != '\0') {
        obits_final = obits_final | 0x100000000000000;
      }
      if (puVar4[0x39] != '\0') {
        obits_final = obits_final | 0x200000000000000;
      }
      if (puVar4[0x3a] != '\0') {
        obits_final = obits_final | 0x400000000000000;
      }
      if (puVar4[0x3b] != '\0') {
        obits_final = obits_final | 0x800000000000000;
      }
      if (puVar4[0x3c] != '\0') {
        obits_final = obits_final | 0x1000000000000000;
      }
      if (puVar4[0x3d] != '\0') {
        obits_final = obits_final | 0x2000000000000000;
      }
      if (puVar4[0x3e] != '\0') {
        obits_final = obits_final | 0x4000000000000000;
      }
      if (puVar4[0x3f] != '\0') {
        obits_final = obits_final | 0x8000000000000000;
      }
      *(uint64_t *)source = obits_final;
      source = source + 8;
    }
    _j_1 = 0;
    for (local_60 = 0; local_60 < iVar1 % 0x40; local_60 = local_60 + 1) {
      if (puVar3[(iVar1 - iVar1 % 0x40) + local_60] != '\0') {
        _j_1 = 1L << ((byte)local_60 & 0x3f) | _j_1;
      }
    }
    *(ulong *)source = _j_1;
  }
  return;
}

Assistant:

void InitCompressedData(Data_Compressed& data_compressed) {
        int w(img_.cols);
        int h(img_.rows);

        for (int i = 0; i < h; i++) {
            uint64_t* mbits = data_compressed[i];
            uchar* source = img_.ptr<uchar>(i);
            for (int j = 0; j < w >> 6; j++) {
                uchar* base = source + (j << 6);
                uint64_t obits = 0;
                if (base[0]) obits |= 0x0000000000000001;
                if (base[1]) obits |= 0x0000000000000002;
                if (base[2]) obits |= 0x0000000000000004;
                if (base[3]) obits |= 0x0000000000000008;
                if (base[4]) obits |= 0x0000000000000010;
                if (base[5]) obits |= 0x0000000000000020;
                if (base[6]) obits |= 0x0000000000000040;
                if (base[7]) obits |= 0x0000000000000080;
                if (base[8]) obits |= 0x0000000000000100;
                if (base[9]) obits |= 0x0000000000000200;
                if (base[10]) obits |= 0x0000000000000400;
                if (base[11]) obits |= 0x0000000000000800;
                if (base[12]) obits |= 0x0000000000001000;
                if (base[13]) obits |= 0x0000000000002000;
                if (base[14]) obits |= 0x0000000000004000;
                if (base[15]) obits |= 0x0000000000008000;
                if (base[16]) obits |= 0x0000000000010000;
                if (base[17]) obits |= 0x0000000000020000;
                if (base[18]) obits |= 0x0000000000040000;
                if (base[19]) obits |= 0x0000000000080000;
                if (base[20]) obits |= 0x0000000000100000;
                if (base[21]) obits |= 0x0000000000200000;
                if (base[22]) obits |= 0x0000000000400000;
                if (base[23]) obits |= 0x0000000000800000;
                if (base[24]) obits |= 0x0000000001000000;
                if (base[25]) obits |= 0x0000000002000000;
                if (base[26]) obits |= 0x0000000004000000;
                if (base[27]) obits |= 0x0000000008000000;
                if (base[28]) obits |= 0x0000000010000000;
                if (base[29]) obits |= 0x0000000020000000;
                if (base[30]) obits |= 0x0000000040000000;
                if (base[31]) obits |= 0x0000000080000000;
                if (base[32]) obits |= 0x0000000100000000;
                if (base[33]) obits |= 0x0000000200000000;
                if (base[34]) obits |= 0x0000000400000000;
                if (base[35]) obits |= 0x0000000800000000;
                if (base[36]) obits |= 0x0000001000000000;
                if (base[37]) obits |= 0x0000002000000000;
                if (base[38]) obits |= 0x0000004000000000;
                if (base[39]) obits |= 0x0000008000000000;
                if (base[40]) obits |= 0x0000010000000000;
                if (base[41]) obits |= 0x0000020000000000;
                if (base[42]) obits |= 0x0000040000000000;
                if (base[43]) obits |= 0x0000080000000000;
                if (base[44]) obits |= 0x0000100000000000;
                if (base[45]) obits |= 0x0000200000000000;
                if (base[46]) obits |= 0x0000400000000000;
                if (base[47]) obits |= 0x0000800000000000;
                if (base[48]) obits |= 0x0001000000000000;
                if (base[49]) obits |= 0x0002000000000000;
                if (base[50]) obits |= 0x0004000000000000;
                if (base[51]) obits |= 0x0008000000000000;
                if (base[52]) obits |= 0x0010000000000000;
                if (base[53]) obits |= 0x0020000000000000;
                if (base[54]) obits |= 0x0040000000000000;
                if (base[55]) obits |= 0x0080000000000000;
                if (base[56]) obits |= 0x0100000000000000;
                if (base[57]) obits |= 0x0200000000000000;
                if (base[58]) obits |= 0x0400000000000000;
                if (base[59]) obits |= 0x0800000000000000;
                if (base[60]) obits |= 0x1000000000000000;
                if (base[61]) obits |= 0x2000000000000000;
                if (base[62]) obits |= 0x4000000000000000;
                if (base[63]) obits |= 0x8000000000000000;
                *mbits = obits, mbits++;
            }
            uint64_t obits_final = 0;
            int jbase = w - (w % 64);
            for (int j = 0; j < w % 64; j++) {
                if (source[jbase + j]) obits_final |= ((uint64_t)1 << j);
            }
            *mbits = obits_final;
        }
    }